

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrlist.h
# Opt level: O0

void __thiscall icu_63::NFRuleList::add(NFRuleList *this,NFRule *thing)

{
  uint uVar1;
  NFRule **ppNVar2;
  NFRule *thing_local;
  NFRuleList *this_local;
  
  if (this->fCount == this->fCapacity) {
    this->fCapacity = this->fCapacity + 10;
    ppNVar2 = (NFRule **)uprv_realloc_63(this->fStuff,(ulong)this->fCapacity << 3);
    this->fStuff = ppNVar2;
  }
  if (this->fStuff == (NFRule **)0x0) {
    this->fCapacity = 0;
    this->fCount = 0;
  }
  else {
    uVar1 = this->fCount;
    this->fCount = uVar1 + 1;
    this->fStuff[uVar1] = thing;
  }
  return;
}

Assistant:

void add(NFRule* thing) {
        if (fCount == fCapacity) {
            fCapacity += 10;
            fStuff = (NFRule**)uprv_realloc(fStuff, fCapacity * sizeof(NFRule*)); // assume success
        }
        if (fStuff != NULL) {
        	fStuff[fCount++] = thing;
        } else {
        	fCapacity = 0;
        	fCount = 0;
        }
    }